

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_msr_banked_arm(CPUARMState *env,uint32_t value,uint32_t tgtmode,uint32_t regno)

{
  int iVar1;
  uint32_t regno_local;
  uint32_t tgtmode_local;
  uint32_t value_local;
  CPUARMState *env_local;
  
  msr_mrs_banked_exc_checks(env,tgtmode,regno);
  if ((7 < regno) && (regno < 0xd)) {
    if (tgtmode == 0x10) {
      env->usr_regs[regno - 8] = value;
      return;
    }
    if (tgtmode != 0x11) {
      return;
    }
    env->fiq_regs[regno - 8] = value;
    return;
  }
  if (3 < regno - 0xd && regno != 0x11) {
LAB_0061f1df:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/op_helper.c"
               ,0x23f,(char *)0x0);
  }
  switch((long)&switchD_0061f145::switchdataD_0136d998 +
         (long)(int)(&switchD_0061f145::switchdataD_0136d998)[regno - 0xd]) {
  case 0x61f147:
    iVar1 = bank_number(tgtmode);
    env->banked_spsr[iVar1] = (ulong)value;
    break;
  case 0x61f175:
    env->elr_el[2] = (ulong)value;
    break;
  case 0x61f187:
    iVar1 = bank_number(tgtmode);
    env->banked_r13[iVar1] = value;
    break;
  case 0x61f1b2:
    iVar1 = r14_bank_number(tgtmode);
    env->banked_r14[iVar1] = value;
    break;
  case 0x61f1dd:
    goto LAB_0061f1df;
  }
  return;
}

Assistant:

void HELPER(msr_banked)(CPUARMState *env, uint32_t value, uint32_t tgtmode,
                        uint32_t regno)
{
    msr_mrs_banked_exc_checks(env, tgtmode, regno);

    if (regno >= 8 && regno <= 12) {
        switch (tgtmode) {
            case ARM_CPU_MODE_USR:
                env->usr_regs[regno - 8] = value;
                break;
            case ARM_CPU_MODE_FIQ:
                env->fiq_regs[regno - 8] = value;
                break;
            default:
                // g_assert_not_reached();
                break;
        }
    } else {
        switch (regno) {
            case 16: /* SPSRs */
                env->banked_spsr[bank_number(tgtmode)] = value;
                break;
            case 17: /* ELR_Hyp */
                env->elr_el[2] = value;
                break;
            case 13:
                env->banked_r13[bank_number(tgtmode)] = value;
                break;
            case 14:
                env->banked_r14[r14_bank_number(tgtmode)] = value;
                break;
            default:
                g_assert_not_reached();
        }
    }
}